

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

BinaryOps LLVMBC::translate_binop(BinOp op,Type *type)

{
  bool bVar1;
  BinaryOps BVar2;
  
  bVar1 = Type::isFloatingPointTy(type);
  switch(op) {
  case ADD:
    return bVar1 + Add;
  case SUB:
    return bVar1 + Sub;
  case MUL:
    return bVar1 + Mul;
  case UDIV:
    BVar2 = UDiv;
    break;
  case SDIV:
    return bVar1 | SDiv;
  case UREM:
    BVar2 = URem;
    break;
  case SREM:
    return bVar1 + SRem;
  case SHL:
    BVar2 = Shl;
    break;
  case LSHR:
    BVar2 = LShr;
    break;
  case ASHR:
    BVar2 = AShr;
    break;
  case AND:
    return (uint)!bVar1 << 4 | InvalidBinaryOp;
  case OR:
    BVar2 = Or;
    break;
  case XOR:
    BVar2 = Xor;
    break;
  default:
    return InvalidBinaryOp;
  }
  if (bVar1) {
    BVar2 = InvalidBinaryOp;
  }
  return BVar2;
}

Assistant:

static BinaryOperator::BinaryOps translate_binop(BinOp op, Type *type)
{
	bool is_fp = type->isFloatingPointTy();
	switch (op)
	{
	case BinOp::ADD:
		return is_fp ? BinaryOperator::BinaryOps::FAdd : BinaryOperator::BinaryOps::Add;
	case BinOp::SUB:
		return is_fp ? BinaryOperator::BinaryOps::FSub : BinaryOperator::BinaryOps::Sub;
	case BinOp::MUL:
		return is_fp ? BinaryOperator::BinaryOps::FMul : BinaryOperator::BinaryOps::Mul;
	case BinOp::UDIV:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::UDiv;
	case BinOp::SDIV:
		return is_fp ? BinaryOperator::BinaryOps::FDiv : BinaryOperator::BinaryOps::SDiv;
	case BinOp::UREM:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::URem;
	case BinOp::SREM:
		return is_fp ? BinaryOperator::BinaryOps::FRem : BinaryOperator::BinaryOps::SRem;
	case BinOp::SHL:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Shl;
	case BinOp::LSHR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::LShr;
	case BinOp::ASHR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::AShr;
	case BinOp::AND:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::And;
	case BinOp::OR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Or;
	case BinOp::XOR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Xor;
	default:
		return BinaryOperator::BinaryOps::InvalidBinaryOp;
	}
}